

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBoss.cpp
# Opt level: O0

void __thiscall CBoss::showInfo(CBoss *this)

{
  ostream *poVar1;
  long *in_RDI;
  string local_28 [40];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"id: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)in_RDI[1]);
  poVar1 = std::operator<<(poVar1,"\tname: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 2));
  poVar1 = std::operator<<(poVar1,"\tlevel:");
  (**(code **)(*in_RDI + 8))();
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"\tduty:");
  poVar1 = std::operator<<(poVar1,"to manage the whole company");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void CBoss::showInfo()
{
    cout << "id: "     << this->_id
         << "\tname: " << this->_name
         << "\tlevel:" << this->getLevel()
         << "\tduty:"
         << "to manage the whole company"
         << endl;
}